

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O2

optional<int> __thiscall Analyser::getIndexInLocal(Analyser *this,string *s)

{
  iterator iVar1;
  mapped_type *pmVar2;
  ulong uVar3;
  ulong uVar4;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>_>_>_>
          ::find(&(this->_localVars)._M_t,s);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->_localVars)._M_t._M_impl.super__Rb_tree_header) {
    uVar3 = 0;
    uVar4 = 0;
  }
  else {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>_>_>_>
             ::operator[](&this->_localVars,s);
    uVar3 = (ulong)(uint)pmVar2->second;
    uVar4 = 0x100000000;
  }
  return (optional<int>)(uVar3 | uVar4);
}

Assistant:

std::optional<std::int32_t> Analyser::getIndexInLocal(const std::string& s) {
	if (_localVars.find(s) != _localVars.end()) {
		return _localVars[s].second;
	}
	else {
		return {};
	}
}